

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-info.cpp
# Opt level: O0

void __thiscall
FileInfoWrapper<ASDCP::DCData::MXFReader,_MyDCDataDescriptor>::~FileInfoWrapper
          (FileInfoWrapper<ASDCP::DCData::MXFReader,_MyDCDataDescriptor> *this)

{
  FileInfoWrapper<ASDCP::DCData::MXFReader,_MyDCDataDescriptor> *this_local;
  
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_0011cd10;
  ASDCP::UL::~UL(&this->m_PictureEssenceCoding);
  ASDCP::WriterInfo::~WriterInfo(&this->m_WriterInfo);
  ASDCP::DCData::MXFReader::~MXFReader(&this->m_Reader);
  return;
}

Assistant:

virtual ~FileInfoWrapper() {}